

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O3

void ngx_rbtree_delete(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  u_char uVar1;
  ngx_rbtree_node_t *pnVar2;
  ngx_rbtree_node_t *pnVar3;
  ngx_rbtree_node_t *pnVar4;
  ngx_rbtree_node_t *temp_1;
  ngx_rbtree_t *pnVar5;
  ngx_rbtree_t *pnVar6;
  ngx_rbtree_node_t *temp;
  ngx_rbtree_node_t *temp_4;
  ngx_rbtree_node_t *pnVar7;
  ngx_rbtree_node_t *pnVar8;
  bool bVar9;
  
  pnVar2 = tree->sentinel;
  pnVar7 = node->right;
  pnVar3 = node;
  if ((node->left != pnVar2) &&
     (bVar9 = pnVar7 != pnVar2, pnVar4 = pnVar7, pnVar7 = node->left, bVar9)) {
    do {
      pnVar3 = pnVar4;
      pnVar4 = pnVar3->left;
    } while (pnVar3->left != pnVar2);
    pnVar7 = pnVar3->right;
  }
  if (pnVar3 == tree->root) {
    tree->root = pnVar7;
    pnVar7->color = '\0';
    node->right = (ngx_rbtree_node_t *)0x0;
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->key = 0;
    node->left = (ngx_rbtree_node_t *)0x0;
    return;
  }
  pnVar4 = pnVar3->parent;
  uVar1 = pnVar3->color;
  (&pnVar4->left)[pnVar3 != pnVar4->left] = pnVar7;
  pnVar8 = pnVar7;
  if (pnVar3 != node) {
    if (pnVar4 == node) {
      pnVar4 = pnVar3;
    }
    pnVar7->parent = pnVar4;
    pnVar3->left = node->left;
    pnVar3->right = node->right;
    pnVar4 = node->parent;
    pnVar3->parent = pnVar4;
    pnVar3->color = node->color;
    pnVar6 = tree;
    if (tree->root != node) {
      pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
      if (pnVar4->left == node) {
        pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
      }
    }
    pnVar6->root = pnVar3;
    if (pnVar3->left != pnVar2) {
      pnVar3->left->parent = pnVar3;
    }
    pnVar4 = pnVar3;
    pnVar8 = pnVar3->right;
    if (pnVar3->right == pnVar2) goto LAB_0011d886;
  }
  pnVar8->parent = pnVar4;
LAB_0011d886:
  node->right = (ngx_rbtree_node_t *)0x0;
  node->parent = (ngx_rbtree_node_t *)0x0;
  node->key = 0;
  node->left = (ngx_rbtree_node_t *)0x0;
  if (uVar1 == '\0') {
    if (pnVar7 != tree->root) {
      do {
        if (pnVar7->color != '\0') break;
        pnVar6 = (ngx_rbtree_t *)&pnVar7->parent;
        pnVar3 = pnVar7->parent;
        pnVar4 = pnVar3->left;
        if (pnVar7 == pnVar4) {
          pnVar4 = pnVar3->right;
          if (pnVar4->color != '\0') {
            pnVar4->color = '\0';
            pnVar3->color = '\x01';
            pnVar7 = pnVar4->left;
            pnVar3->right = pnVar7;
            if (pnVar7 != pnVar2) {
              pnVar7->parent = pnVar3;
            }
            pnVar7 = pnVar3->parent;
            pnVar4->parent = pnVar7;
            pnVar5 = tree;
            if (tree->root != pnVar3) {
              pnVar5 = (ngx_rbtree_t *)&pnVar7->right;
              if (pnVar7->left == pnVar3) {
                pnVar5 = (ngx_rbtree_t *)&pnVar7->left;
              }
            }
            pnVar5->root = pnVar4;
            pnVar4->left = pnVar3;
            pnVar3->parent = pnVar4;
            pnVar3 = *(ngx_rbtree_node_t **)pnVar6;
            pnVar4 = pnVar3->right;
          }
          pnVar7 = pnVar4->left;
          pnVar8 = pnVar4->right;
          if (pnVar7->color == '\0') {
            if (pnVar8->color == '\0') goto LAB_0011daee;
          }
          else if (pnVar8->color == '\0') {
            pnVar7->color = '\0';
            pnVar4->color = '\x01';
            pnVar3 = pnVar7->right;
            pnVar4->left = pnVar3;
            if (pnVar3 != pnVar2) {
              pnVar3->parent = pnVar4;
            }
            pnVar3 = pnVar4->parent;
            pnVar7->parent = pnVar3;
            pnVar5 = tree;
            if (tree->root != pnVar4) {
              pnVar5 = (ngx_rbtree_t *)&pnVar3->left;
              if (pnVar3->right == pnVar4) {
                pnVar5 = (ngx_rbtree_t *)&pnVar3->right;
              }
            }
            pnVar5->root = pnVar7;
            pnVar7->right = pnVar4;
            pnVar4->parent = pnVar7;
            pnVar3 = *(ngx_rbtree_node_t **)pnVar6;
            pnVar4 = pnVar3->right;
            pnVar7 = pnVar4->left;
            pnVar8 = pnVar4->right;
          }
          pnVar4->color = pnVar3->color;
          pnVar3->color = '\0';
          pnVar8->color = '\0';
          pnVar3->right = pnVar7;
          if (pnVar7 != pnVar2) {
            pnVar7->parent = pnVar3;
          }
          pnVar7 = pnVar3->parent;
          pnVar4->parent = pnVar7;
          pnVar6 = tree;
          if (tree->root != pnVar3) {
            pnVar6 = (ngx_rbtree_t *)&pnVar7->right;
            if (pnVar7->left == pnVar3) {
              pnVar6 = (ngx_rbtree_t *)&pnVar7->left;
            }
          }
          pnVar6->root = pnVar4;
          pnVar4->left = pnVar3;
LAB_0011dad9:
          pnVar3->parent = pnVar4;
          pnVar6 = tree;
        }
        else {
          if (pnVar4->color != '\0') {
            pnVar4->color = '\0';
            pnVar3->color = '\x01';
            pnVar7 = pnVar4->right;
            pnVar3->left = pnVar7;
            if (pnVar7 != pnVar2) {
              pnVar7->parent = pnVar3;
            }
            pnVar7 = pnVar3->parent;
            pnVar4->parent = pnVar7;
            pnVar5 = tree;
            if (tree->root != pnVar3) {
              pnVar5 = (ngx_rbtree_t *)&pnVar7->left;
              if (pnVar7->right == pnVar3) {
                pnVar5 = (ngx_rbtree_t *)&pnVar7->right;
              }
            }
            pnVar5->root = pnVar4;
            pnVar4->right = pnVar3;
            pnVar3->parent = pnVar4;
            pnVar3 = *(ngx_rbtree_node_t **)pnVar6;
            pnVar4 = pnVar3->left;
          }
          pnVar7 = pnVar4->left;
          if (pnVar7->color != '\0') {
LAB_0011d97f:
            pnVar4->color = pnVar3->color;
            pnVar3->color = '\0';
            pnVar7->color = '\0';
            pnVar7 = pnVar4->right;
            pnVar3->left = pnVar7;
            if (pnVar7 != pnVar2) {
              pnVar7->parent = pnVar3;
            }
            pnVar7 = pnVar3->parent;
            pnVar4->parent = pnVar7;
            pnVar6 = tree;
            if (tree->root != pnVar3) {
              pnVar6 = (ngx_rbtree_t *)&pnVar7->left;
              if (pnVar7->right == pnVar3) {
                pnVar6 = (ngx_rbtree_t *)&pnVar7->right;
              }
            }
            pnVar6->root = pnVar4;
            pnVar4->right = pnVar3;
            goto LAB_0011dad9;
          }
          pnVar7 = pnVar4->right;
          if (pnVar7->color != '\0') {
            pnVar7->color = '\0';
            pnVar4->color = '\x01';
            pnVar3 = pnVar7->left;
            pnVar4->right = pnVar3;
            if (pnVar3 != pnVar2) {
              pnVar3->parent = pnVar4;
            }
            pnVar3 = pnVar4->parent;
            pnVar7->parent = pnVar3;
            pnVar5 = tree;
            if (tree->root != pnVar4) {
              pnVar5 = (ngx_rbtree_t *)&pnVar3->right;
              if (pnVar3->left == pnVar4) {
                pnVar5 = (ngx_rbtree_t *)&pnVar3->left;
              }
            }
            pnVar5->root = pnVar7;
            pnVar7->left = pnVar4;
            pnVar4->parent = pnVar7;
            pnVar3 = *(ngx_rbtree_node_t **)pnVar6;
            pnVar4 = pnVar3->left;
            pnVar7 = pnVar4->left;
            goto LAB_0011d97f;
          }
LAB_0011daee:
          pnVar4->color = '\x01';
        }
        pnVar7 = pnVar6->root;
      } while (pnVar7 != tree->root);
    }
    pnVar7->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_delete(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_uint_t           red;
    ngx_rbtree_node_t  **root, *sentinel, *subst, *temp, *w;

    /* a binary tree delete */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (node->left == sentinel) {
        temp = node->right;
        subst = node;

    } else if (node->right == sentinel) {
        temp = node->left;
        subst = node;

    } else {
        subst = ngx_rbtree_min(node->right, sentinel);

        if (subst->left != sentinel) {
            temp = subst->left;
        } else {
            temp = subst->right;
        }
    }

    if (subst == *root) {
        *root = temp;
        ngx_rbt_black(temp);

        /* DEBUG stuff */
        node->left = NULL;
        node->right = NULL;
        node->parent = NULL;
        node->key = 0;

        return;
    }

    red = ngx_rbt_is_red(subst);

    if (subst == subst->parent->left) {
        subst->parent->left = temp;

    } else {
        subst->parent->right = temp;
    }

    if (subst == node) {

        temp->parent = subst->parent;

    } else {

        if (subst->parent == node) {
            temp->parent = subst;

        } else {
            temp->parent = subst->parent;
        }

        subst->left = node->left;
        subst->right = node->right;
        subst->parent = node->parent;
        ngx_rbt_copy_color(subst, node);

        if (node == *root) {
            *root = subst;

        } else {
            if (node == node->parent->left) {
                node->parent->left = subst;
            } else {
                node->parent->right = subst;
            }
        }

        if (subst->left != sentinel) {
            subst->left->parent = subst;
        }

        if (subst->right != sentinel) {
            subst->right->parent = subst;
        }
    }

    /* DEBUG stuff */
    node->left = NULL;
    node->right = NULL;
    node->parent = NULL;
    node->key = 0;

    if (red) {
        return;
    }

    /* a delete fixup */

    while (temp != *root && ngx_rbt_is_black(temp)) {

        if (temp == temp->parent->left) {
            w = temp->parent->right;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                w = temp->parent->right;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->right)) {
                    ngx_rbt_black(w->left);
                    ngx_rbt_red(w);
                    ngx_rbtree_right_rotate(root, sentinel, w);
                    w = temp->parent->right;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->right);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                temp = *root;
            }

        } else {
            w = temp->parent->left;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                w = temp->parent->left;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->left)) {
                    ngx_rbt_black(w->right);
                    ngx_rbt_red(w);
                    ngx_rbtree_left_rotate(root, sentinel, w);
                    w = temp->parent->left;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->left);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                temp = *root;
            }
        }
    }

    ngx_rbt_black(temp);
}